

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  bool bVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  long lVar8;
  long lVar9;
  JSAMPROW pJVar10;
  ulong uVar11;
  
  iVar1 = cinfo->num_components;
  lVar8 = (long)iVar1;
  uVar6 = (ulong)cinfo->output_width;
  if (lVar8 == 3) {
    if (0 < num_rows) {
      do {
        if (uVar6 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar7 = input_buf[1][input_row];
          pJVar3 = input_buf[2][input_row];
          pJVar10 = *output_buf;
          uVar11 = 0;
          do {
            *pJVar10 = pJVar2[uVar11];
            pJVar10[1] = pJVar7[uVar11];
            pJVar10[2] = pJVar3[uVar11];
            pJVar10 = pJVar10 + 3;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
  }
  else if (iVar1 == 4) {
    if (0 < num_rows) {
      do {
        if (uVar6 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar7 = input_buf[1][input_row];
          pJVar3 = input_buf[2][input_row];
          pJVar10 = input_buf[3][input_row];
          pJVar4 = *output_buf;
          uVar11 = 0;
          do {
            pJVar4[uVar11 * 4] = pJVar2[uVar11];
            pJVar4[uVar11 * 4 + 1] = pJVar7[uVar11];
            pJVar4[uVar11 * 4 + 2] = pJVar3[uVar11];
            pJVar4[uVar11 * 4 + 3] = pJVar10[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
  }
  else if (0 < num_rows) {
    do {
      if (0 < iVar1) {
        lVar9 = 0;
        do {
          if (uVar6 != 0) {
            pJVar2 = input_buf[lVar9][input_row];
            pJVar7 = *output_buf + lVar9;
            uVar11 = 0;
            do {
              *pJVar7 = pJVar2[uVar11];
              uVar11 = uVar11 + 1;
              pJVar7 = pJVar7 + lVar8;
            } while (uVar6 != uVar11);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar8);
      }
      output_buf = output_buf + 1;
      input_row = input_row + 1;
      bVar5 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
             JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, inptr0, inptr1, inptr2, inptr3, outptr;
  register JDIMENSION col;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  if (num_components == 3) {
    while (--num_rows >= 0) {
      inptr0 = input_buf[0][input_row];
      inptr1 = input_buf[1][input_row];
      inptr2 = input_buf[2][input_row];
      input_row++;
      outptr = *output_buf++;
      for (col = 0; col < num_cols; col++) {
        *outptr++ = inptr0[col];
        *outptr++ = inptr1[col];
        *outptr++ = inptr2[col];
      }
    }
  } else if (num_components == 4) {
    while (--num_rows >= 0) {
      inptr0 = input_buf[0][input_row];
      inptr1 = input_buf[1][input_row];
      inptr2 = input_buf[2][input_row];
      inptr3 = input_buf[3][input_row];
      input_row++;
      outptr = *output_buf++;
      for (col = 0; col < num_cols; col++) {
        *outptr++ = inptr0[col];
        *outptr++ = inptr1[col];
        *outptr++ = inptr2[col];
        *outptr++ = inptr3[col];
      }
    }
  } else {
    while (--num_rows >= 0) {
      for (ci = 0; ci < num_components; ci++) {
        inptr = input_buf[ci][input_row];
        outptr = *output_buf;
        for (col = 0; col < num_cols; col++) {
          outptr[ci] = inptr[col];
          outptr += num_components;
        }
      }
      output_buf++;
      input_row++;
    }
  }
}